

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeDeviceGetSubDevices
          (ze_device_handle_t hDevice,uint32_t *pCount,ze_device_handle_t *phSubdevices)

{
  ze_device_handle_t p_Var1;
  bool bVar2;
  ulong local_38;
  size_t i;
  ze_pfnDeviceGetSubDevices_t pfnGetSubDevices;
  ze_result_t result;
  ze_device_handle_t *phSubdevices_local;
  uint32_t *pCount_local;
  ze_device_handle_t hDevice_local;
  
  pfnGetSubDevices._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c220 == (code *)0x0) {
    local_38 = 0;
    while( true ) {
      bVar2 = false;
      if (phSubdevices != (ze_device_handle_t *)0x0) {
        bVar2 = local_38 < *pCount;
      }
      if (!bVar2) break;
      p_Var1 = (ze_device_handle_t)context_t::get((context_t *)&context);
      phSubdevices[local_38] = p_Var1;
      local_38 = local_38 + 1;
    }
  }
  else {
    pfnGetSubDevices._4_4_ = (*DAT_0011c220)(hDevice,pCount,phSubdevices);
  }
  return pfnGetSubDevices._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeDeviceGetSubDevices(
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        uint32_t* pCount,                               ///< [in,out] pointer to the number of sub-devices.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of sub-devices available.
                                                        ///< if count is greater than the number of sub-devices available, then the
                                                        ///< driver shall update the value with the correct number of sub-devices available.
        ze_device_handle_t* phSubdevices                ///< [in,out][optional][range(0, *pCount)] array of handle of sub-devices.
                                                        ///< if count is less than the number of sub-devices available, then driver
                                                        ///< shall only retrieve that number of sub-devices.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetSubDevices = context.zeDdiTable.Device.pfnGetSubDevices;
        if( nullptr != pfnGetSubDevices )
        {
            result = pfnGetSubDevices( hDevice, pCount, phSubdevices );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phSubdevices ) && ( i < *pCount ); ++i )
                phSubdevices[ i ] = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }